

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::BinaryStandardOperatorWrapper,duckdb::AddOperator,bool>
               (interval_t *ldata,interval_t *rdata,interval_t *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  ulong *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  sel_t *psVar6;
  undefined4 uVar8;
  undefined4 uVar9;
  unsigned_long *puVar7;
  undefined4 uVar10;
  undefined4 uVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar12;
  element_type *peVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  ulong uVar15;
  TemplatedValidityData<unsigned_long> *pTVar16;
  ulong uVar17;
  idx_t idx_in_entry;
  ulong uVar18;
  sel_t *psVar19;
  int64_t *piVar20;
  interval_t left;
  interval_t iVar21;
  interval_t right;
  interval_t right_00;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  buffer_ptr<ValidityBuffer> *local_48;
  sel_t *local_40;
  idx_t local_38;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    if (count != 0) {
      psVar19 = lsel->sel_vector;
      psVar6 = rsel->sel_vector;
      piVar20 = &result_data->micros;
      uVar18 = 0;
      do {
        uVar15 = uVar18;
        if (psVar19 != (sel_t *)0x0) {
          uVar15 = (ulong)psVar19[uVar18];
        }
        uVar17 = uVar18;
        if (psVar6 != (sel_t *)0x0) {
          uVar17 = (ulong)psVar6[uVar18];
        }
        uVar2 = ldata[uVar15].months;
        uVar8 = ldata[uVar15].days;
        left.days = uVar8;
        left.months = uVar2;
        uVar3 = rdata[uVar17].months;
        uVar9 = rdata[uVar17].days;
        right.days = uVar9;
        right.months = uVar3;
        left.micros = ldata[uVar15].micros;
        right.micros = rdata[uVar17].micros;
        iVar21 = AddOperator::Operation<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t>
                           (left,right);
        ((interval_t *)(piVar20 + -1))->months = (int)iVar21._0_8_;
        ((interval_t *)(piVar20 + -1))->days = (int)((ulong)iVar21._0_8_ >> 0x20);
        *piVar20 = iVar21.micros;
        uVar18 = uVar18 + 1;
        piVar20 = piVar20 + 2;
      } while (count != uVar18);
    }
  }
  else if (count != 0) {
    psVar19 = lsel->sel_vector;
    psVar6 = rsel->sel_vector;
    local_48 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    piVar20 = &result_data->micros;
    uVar18 = 0;
    local_40 = psVar19;
    do {
      uVar15 = uVar18;
      if (psVar19 != (sel_t *)0x0) {
        uVar15 = (ulong)psVar19[uVar18];
      }
      uVar17 = uVar18;
      if (psVar6 != (sel_t *)0x0) {
        uVar17 = (ulong)psVar6[uVar18];
      }
      puVar7 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (((puVar7 == (unsigned_long *)0x0) || ((puVar7[uVar15 >> 6] >> (uVar15 & 0x3f) & 1) != 0))
         && ((puVar7 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
             puVar7 == (unsigned_long *)0x0 || ((puVar7[uVar17 >> 6] >> (uVar17 & 0x3f) & 1) != 0)))
         ) {
        uVar4 = ldata[uVar15].months;
        uVar10 = ldata[uVar15].days;
        iVar21.days = uVar10;
        iVar21.months = uVar4;
        uVar5 = rdata[uVar17].months;
        uVar11 = rdata[uVar17].days;
        right_00.days = uVar11;
        right_00.months = uVar5;
        iVar21.micros = ldata[uVar15].micros;
        right_00.micros = rdata[uVar17].micros;
        iVar21 = AddOperator::Operation<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t>
                           (iVar21,right_00);
        ((interval_t *)(piVar20 + -1))->months = (int)iVar21._0_8_;
        ((interval_t *)(piVar20 + -1))->days = (int)((ulong)iVar21._0_8_ >> 0x20);
        *piVar20 = iVar21.micros;
      }
      else {
        if ((result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0) {
          local_38 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var14 = p_Stack_50;
          peVar13 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar13;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var14;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_48);
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)
               (pTVar16->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          psVar19 = local_40;
        }
        bVar12 = (byte)uVar18 & 0x3f;
        puVar1 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                 (uVar18 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar12 | 0xfffffffffffffffeU >> 0x40 - bVar12);
      }
      uVar18 = uVar18 + 1;
      piVar20 = piVar20 + 2;
    } while (count != uVar18);
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}